

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_enc.c
# Opt level: O3

int TBufferNewPage(VP8TBuffer *b)

{
  VP8Tokens *pVVar1;
  
  if ((b->error_ == 0) &&
     (pVVar1 = (VP8Tokens *)WebPSafeMalloc(1,(long)b->page_size_ * 2 + 8),
     pVVar1 != (VP8Tokens *)0x0)) {
    pVVar1->next_ = (VP8Tokens *)0x0;
    *b->last_page_ = pVVar1;
    b->last_page_ = (VP8Tokens **)pVVar1;
    b->left_ = b->page_size_;
    b->tokens_ = (uint16_t *)(pVVar1 + 1);
    return 1;
  }
  b->error_ = 1;
  return 0;
}

Assistant:

static int TBufferNewPage(VP8TBuffer* const b) {
  VP8Tokens* page = NULL;
  if (!b->error_) {
    const size_t size = sizeof(*page) + b->page_size_ * sizeof(token_t);
    page = (VP8Tokens*)WebPSafeMalloc(1ULL, size);
  }
  if (page == NULL) {
    b->error_ = 1;
    return 0;
  }
  page->next_ = NULL;

  *b->last_page_ = page;
  b->last_page_ = &page->next_;
  b->left_ = b->page_size_;
  b->tokens_ = (token_t*)TOKEN_DATA(page);
  return 1;
}